

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool __thiscall QMYSQLResult::reset(QMYSQLResult *this,QString *query)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  QMYSQLResultPrivate *p;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  QMYSQLDriverPrivate *pQVar7;
  QList<QMYSQLResultPrivate::QMyField> *this_00;
  qsizetype qVar8;
  MYSQL_RES *pMVar9;
  QMYSQLResultPrivate *this_01;
  QMetaType QVar10;
  reference pQVar11;
  EVP_PKEY_CTX *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  MYSQL_FIELD *field;
  int i;
  int numFields;
  QMYSQLResultPrivate *d;
  QByteArray encQuery;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QMYSQLResultPrivate *in_stack_ffffffffffffff40;
  MYSQL *size;
  int local_94;
  EVP_PKEY_CTX *pEVar12;
  ErrorType type;
  QString *err;
  bool local_69;
  char local_60 [24];
  QSqlError local_48 [8];
  char local_40 [24];
  QSqlError local_28 [8];
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar12 = in_RSI;
  err = in_RDI;
  p = d_func((QMYSQLResult *)0x10c1c5);
  type = (ErrorType)((ulong)pEVar12 >> 0x20);
  lVar4 = QSqlResult::driver();
  if (lVar4 != 0) {
    plVar5 = (long *)QSqlResult::driver();
    uVar6 = (**(code **)(*plVar5 + 0x60))();
    if ((uVar6 & 1) != 0) {
      QSqlResult::driver();
      uVar6 = QSqlDriver::isOpenError();
      if ((uVar6 & 1) == 0) {
        p->preparedQuery = false;
        cleanup((QMYSQLResult *)in_RDI,in_RSI);
        local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_20.d.size = -0x5555555555555556;
        QString::toUtf8((QString *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        pQVar7 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
        size = pQVar7->mysql;
        this_00 = (QList<QMYSQLResultPrivate::QMyField> *)
                  QByteArray::data((QByteArray *)in_stack_ffffffffffffff40);
        qVar8 = QByteArray::size(&local_20);
        iVar2 = mysql_real_query(size,this_00,qVar8);
        if (iVar2 == 0) {
          pQVar7 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
          pMVar9 = (MYSQL_RES *)mysql_store_result(pQVar7->mysql);
          p->result = pMVar9;
          if (p->result == (MYSQL_RES *)0x0) {
            pQVar7 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
            iVar2 = mysql_field_count(pQVar7->mysql);
            if (iVar2 != 0) {
              QCoreApplication::translate(local_60,"QMYSQLResult","Unable to store result",0);
              QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
              qMakeError(err,type,(QMYSQLDriverPrivate *)p);
              (*(code *)(in_RDI->d).d[2].super_QArrayData.alloc)(in_RDI,local_48);
              QSqlError::~QSqlError(local_48);
              QString::~QString((QString *)0x10c40c);
              local_69 = false;
              goto LAB_0010c57a;
            }
          }
          pQVar7 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
          iVar2 = mysql_field_count(pQVar7->mysql);
          (*(code *)(in_RDI->d).d[3].super_QArrayData.alloc)(in_RDI,iVar2 != 0);
          QList<QMYSQLResultPrivate::QMyField>::resize(this_00,(qsizetype)size);
          pQVar7 = QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
          iVar3 = mysql_affected_rows(pQVar7->mysql);
          p->rowsAffected = iVar3;
          uVar6 = QSqlResult::isSelect();
          if ((uVar6 & 1) != 0) {
            for (local_94 = 0; local_94 < iVar2; local_94 = local_94 + 1) {
              this_01 = (QMYSQLResultPrivate *)mysql_fetch_field_direct(p->result,local_94);
              QVar10 = qDecodeMYSQLType((enum_field_types)((ulong)in_stack_ffffffffffffff40 >> 0x20)
                                        ,(uint)in_stack_ffffffffffffff40);
              pQVar11 = QList<QMYSQLResultPrivate::QMyField>::operator[]
                                  ((QList<QMYSQLResultPrivate::QMyField> *)in_stack_ffffffffffffff40
                                   ,CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
              (pQVar11->type).d_ptr = QVar10.d_ptr;
              pQVar11 = QList<QMYSQLResultPrivate::QMyField>::operator[]
                                  ((QList<QMYSQLResultPrivate::QMyField> *)this_01,
                                   CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
              pQVar11->myField = (MYSQL_FIELD *)this_01;
              in_stack_ffffffffffffff40 = this_01;
            }
            (*(code *)(in_RDI->d).d[1].super_QArrayData.alloc)(in_RDI,0xffffffff);
          }
          (**(code **)&(in_RDI->d).d[2].super_QArrayData)(in_RDI,1);
          bVar1 = QSqlResult::isActive();
          local_69 = (bool)(bVar1 & 1);
        }
        else {
          QCoreApplication::translate(local_40,"QMYSQLResult","Unable to execute query",0);
          QMYSQLResultPrivate::drv_d_func(in_stack_ffffffffffffff40);
          qMakeError(err,type,(QMYSQLDriverPrivate *)p);
          (*(code *)(in_RDI->d).d[2].super_QArrayData.alloc)(in_RDI,local_28);
          QSqlError::~QSqlError(local_28);
          QString::~QString((QString *)0x10c333);
          local_69 = false;
        }
LAB_0010c57a:
        QByteArray::~QByteArray((QByteArray *)0x10c587);
        goto LAB_0010c587;
      }
    }
  }
  local_69 = false;
LAB_0010c587:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QMYSQLResult::reset (const QString& query)
{
    Q_D(QMYSQLResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->preparedQuery = false;

    cleanup();

    const QByteArray encQuery = query.toUtf8();
    if (mysql_real_query(d->drv_d_func()->mysql, encQuery.data(), encQuery.size())) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to execute query"),
                     QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    d->result = mysql_store_result(d->drv_d_func()->mysql);
    if (!d->result && mysql_field_count(d->drv_d_func()->mysql) > 0) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to store result"),
                    QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    int numFields = mysql_field_count(d->drv_d_func()->mysql);
    setSelect(numFields != 0);
    d->fields.resize(numFields);
    d->rowsAffected = mysql_affected_rows(d->drv_d_func()->mysql);

    if (isSelect()) {
        for(int i = 0; i < numFields; i++) {
            MYSQL_FIELD* field = mysql_fetch_field_direct(d->result, i);
            d->fields[i].type = qDecodeMYSQLType(field->type, field->flags);
            d->fields[i].myField = field;
        }
        setAt(QSql::BeforeFirstRow);
    }
    setActive(true);
    return isActive();
}